

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer.cpp
# Opt level: O3

void __thiscall CMU462::PathTracer::~PathTracer(PathTracer *this)

{
  BVHAccel *this_00;
  pointer pLVar1;
  pointer pWVar2;
  pointer pptVar3;
  pointer puVar4;
  pointer pSVar5;
  pointer piVar6;
  
  this_00 = this->bvh;
  if (this_00 != (BVHAccel *)0x0) {
    StaticScene::BVHAccel::~BVHAccel(this_00);
  }
  operator_delete(this_00);
  if (this->gridSampler != (Sampler2D *)0x0) {
    (*this->gridSampler->_vptr_Sampler2D[1])();
  }
  if (this->hemisphereSampler != (Sampler3D *)0x0) {
    (*this->hemisphereSampler->_vptr_Sampler3D[1])();
  }
  pLVar1 = (this->rayLog).super__Vector_base<CMU462::LoggedRay,_std::allocator<CMU462::LoggedRay>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pLVar1 != (pointer)0x0) {
    operator_delete(pLVar1);
  }
  std::_Deque_base<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
  ::~_Deque_base((_Deque_base<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
                  *)&this->selectionHistory);
  pWVar2 = (this->workQueue).storage.
           super__Vector_base<CMU462::WorkItem,_std::allocator<CMU462::WorkItem>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pWVar2 != (pointer)0x0) {
    operator_delete(pWVar2);
  }
  pptVar3 = (this->workerThreads).super__Vector_base<std::thread_*,_std::allocator<std::thread_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (pptVar3 != (pointer)0x0) {
    operator_delete(pptVar3);
  }
  puVar4 = (this->frameBuffer).data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar4 != (pointer)0x0) {
    operator_delete(puVar4);
  }
  pSVar5 = (this->sampleBuffer).data.
           super__Vector_base<CMU462::Spectrum,_std::allocator<CMU462::Spectrum>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pSVar5 != (pointer)0x0) {
    operator_delete(pSVar5);
  }
  piVar6 = (this->tile_samples).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar6 != (pointer)0x0) {
    operator_delete(piVar6);
    return;
  }
  return;
}

Assistant:

PathTracer::~PathTracer() {
  delete bvh;
  delete gridSampler;
  delete hemisphereSampler;
}